

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CumulativeReporterBase<Catch::JunitReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__JunitReporter_00b4cdc8;
  pcVar2 = (this->stdErrForSuite)._M_dataplus._M_p;
  paVar1 = &(this->stdErrForSuite).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->stdOutForSuite)._M_dataplus._M_p;
  paVar1 = &(this->stdOutForSuite).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  XmlWriter::~XmlWriter(&this->xml);
  CumulativeReporterBase<Catch::JunitReporter>::~CumulativeReporterBase
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}